

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool P_CheckMissileSpawn(AActor *th,double maxdist)

{
  int iVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint uVar4;
  double dVar5;
  bool local_18d;
  TFlags<ActorFlag5,_unsigned_int> local_170;
  TFlags<ActorFlag2,_unsigned_int> local_16c;
  DVector3 local_168;
  TVector2<double> local_150;
  TFlags<ActorBounceFlag,_unsigned_short> local_13e [9];
  TFlags<ActorFlag,_unsigned_int> local_12c;
  bool local_125;
  TFlags local_124 [4];
  undefined1 local_120 [3];
  bool MBFGrenade;
  FCheckPosition tm;
  TVector3<double> local_70;
  TVector3<double> local_58;
  double maxsquared;
  DVector3 advance;
  double maxdist_local;
  AActor *th_local;
  
  iVar1 = (int)th;
  TFlags<ActorFlag4,_unsigned_int>::operator&
            ((TFlags<ActorFlag4,_unsigned_int> *)((long)&advance.Z + 4),
             iVar1 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
  uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&advance.Z + 4));
  bVar2 = false;
  if (uVar4 != 0) {
    bVar2 = 0 < th->tics;
  }
  if (bVar2) {
    uVar4 = FRandom::operator()(&pr_checkmissilespawn);
    th->tics = th->tics - (uVar4 & 3);
    if (th->tics < 1) {
      th->tics = 1;
    }
  }
  if (0.0 < maxdist) {
    TVector3<double>::TVector3((TVector3<double> *)&maxsquared,&th->Vel);
    local_58.Z = maxdist * maxdist;
    do {
      TVector3<double>::operator*=((TVector3<double> *)&maxsquared,0.5);
      TVector3<double>::XY(&local_58);
      dVar5 = TVector2<double>::LengthSquared((TVector2<double> *)&local_58);
    } while (local_58.Z <= dVar5);
    AActor::Pos((DVector3 *)&tm.DoRipping,th);
    TVector3<double>::operator+
              (&local_70,(TVector3<double> *)&tm.DoRipping,(TVector3<double> *)&maxsquared);
    AActor::SetXYZ(th,&local_70);
  }
  TFlags<ActorFlag2,_unsigned_int>::operator&
            ((TFlags<ActorFlag2,_unsigned_int> *)local_124,iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY))
  ;
  uVar4 = TFlags::operator_cast_to_unsigned_int(local_124);
  FCheckPosition::FCheckPosition((FCheckPosition *)local_120,uVar4 != 0);
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_12c,iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
  uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_12c);
  local_18d = true;
  if (uVar4 != 0) {
    TFlags<ActorBounceFlag,_unsigned_short>::operator&
              (local_13e,iVar1 + (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_AutoOff|BOUNCE_Actors));
    uVar3 = TFlags::operator_cast_to_unsigned_short((TFlags *)local_13e);
    local_18d = uVar3 != 0;
  }
  local_125 = local_18d;
  AActor::Pos(&local_168,th);
  TVector2<double>::TVector2(&local_150,&local_168);
  bVar2 = P_TryMove(th,&local_150,0,(secplane_t *)0x0,(FCheckPosition *)local_120,true);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    bVar2 = true;
    if (th->BlockingMobj != (AActor *)0x0) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_16c,iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
      uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_16c);
      bVar2 = true;
      if (uVar4 != 0) {
        TFlags<ActorFlag5,_unsigned_int>::operator&
                  (&local_170,
                   (int)th->BlockingMobj +
                   (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|MF5_NOFORWARDFALL|MF5_NODROPOFF)
                  );
        uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_170);
        bVar2 = uVar4 != 0;
      }
    }
    if (bVar2) {
      AActor::ClearCounters(th);
      if ((th->BlockingLine == (line_t *)0x0) || (th->BlockingLine->special != 9)) {
        if (((local_125 & 1U) == 0) || (th->BlockingLine == (line_t *)0x0)) {
          P_ExplodeMissile(th,(line_t *)0x0,th->BlockingMobj);
        }
        else {
          P_BounceWall(th);
        }
      }
      else {
        (*(th->super_DThinker).super_DObject._vptr_DObject[4])();
      }
      th_local._7_1_ = false;
      goto LAB_0069e6e9;
    }
  }
  AActor::ClearInterpolation(th);
  th_local._7_1_ = true;
LAB_0069e6e9:
  FCheckPosition::~FCheckPosition((FCheckPosition *)local_120);
  return th_local._7_1_;
}

Assistant:

bool P_CheckMissileSpawn (AActor* th, double maxdist)
{
	// [RH] Don't decrement tics if they are already less than 1
	if ((th->flags4 & MF4_RANDOMIZE) && th->tics > 0)
	{
		th->tics -= pr_checkmissilespawn() & 3;
		if (th->tics < 1)
			th->tics = 1;
	}

	if (maxdist > 0)
	{
		// move a little forward so an angle can be computed if it immediately explodes
		DVector3 advance = th->Vel;
		double maxsquared = maxdist*maxdist;

		// Keep halving the advance vector until we get something less than maxdist
		// units away, since we still want to spawn the missile inside the shooter.
		do
		{
			advance *= 0.5f;
		}
		while (advance.XY().LengthSquared() >= maxsquared);
		th->SetXYZ(th->Pos() + advance);
	}

	FCheckPosition tm(!!(th->flags2 & MF2_RIP));

	// killough 8/12/98: for non-missile objects (e.g. grenades)
	// 
	// [GZ] MBF excludes non-missile objects from the P_TryMove test
	// and subsequent potential P_ExplodeMissile call. That is because
	// in MBF, a projectile is not an actor with the MF_MISSILE flag
	// but an actor with either or both the MF_MISSILE and MF_BOUNCES
	// flags, and a grenade is identified by not having MF_MISSILE.
	// Killough wanted grenades not to explode directly when spawned,
	// therefore they can be fired safely even when humping a wall as
	// they will then just drop on the floor at their shooter's feet.
	//
	// However, ZDoom does allow non-missiles to be shot as well, so
	// Killough's check for non-missiles is inadequate here. So let's
	// replace it by a check for non-missile and MBF bounce type.
	// This should allow MBF behavior where relevant without altering
	// established ZDoom behavior for crazy stuff like a cacodemon cannon.
	bool MBFGrenade = (!(th->flags & MF_MISSILE) || (th->BounceFlags & BOUNCE_MBF));

	// killough 3/15/98: no dropoff (really = don't care for missiles)
	if (!(P_TryMove (th, th->Pos(), false, NULL, tm, true)))
	{
		// [RH] Don't explode ripping missiles that spawn inside something
		if (th->BlockingMobj == NULL || !(th->flags2 & MF2_RIP) || (th->BlockingMobj->flags5 & MF5_DONTRIP))
		{
			// If this is a monster spawned by A_CustomMissile subtract it from the counter.
			th->ClearCounters();
			// [RH] Don't explode missiles that spawn on top of horizon lines
			if (th->BlockingLine != NULL && th->BlockingLine->special == Line_Horizon)
			{
				th->Destroy ();
			}
			else if (MBFGrenade && th->BlockingLine != NULL)
			{
				P_BounceWall(th);
			}
			else
			{
				P_ExplodeMissile (th, NULL, th->BlockingMobj);
			}
			return false;
		}
	}
	th->ClearInterpolation();
	return true;
}